

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

void __thiscall PlayerStrategy::PlayerStrategy(PlayerStrategy *this,Player *player)

{
  int *piVar1;
  string *__return_storage_ptr__;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_0013d8d0;
  piVar1 = (int *)operator_new(4);
  *piVar1 = -1;
  this->numWeakest = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->exchangingCardType = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->armiesToPlace = piVar1;
  this->player = player;
  this->from = (Country *)0x0;
  this->to = (Country *)0x0;
  __return_storage_ptr__ = (string *)operator_new(0x20);
  getStrategyName_abi_cxx11_(__return_storage_ptr__,player->strategy);
  this->strategyName = __return_storage_ptr__;
  return;
}

Assistant:

PlayerStrategy::PlayerStrategy(Player* player) {
    this->exchangingCardType = new int(0);
    this->armiesToPlace = new int(0);
    this->player = player;
    this->from = nullptr;
    this->to = nullptr;
    this->strategyName = new std::string(player->getStrategy()->getStrategyName());
}